

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

void __thiscall
ASDCP::MXF::JPEGXSPictureSubDescriptor::JPEGXSPictureSubDescriptor
          (JPEGXSPictureSubDescriptor *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  MDDEntry *pMVar3;
  
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__JPEGXSPictureSubDescriptor_002270f8;
  this->JPEGXSPpih = 0;
  this->JPEGXSPlev = 0;
  this->JPEGXSWf = 0;
  this->JPEGXSHf = 0;
  this->JPEGXSNc = '\0';
  Raw::Raw(&this->JPEGXSComponentTable);
  (this->JPEGXSCw).m_has_value = false;
  (this->JPEGXSHsl).m_has_value = false;
  (this->JPEGXSMaximumBitRate).m_has_value = false;
  this_00 = (this->super_InterchangeObject).m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar3 = Dictionary::Type(this_00,MDD_JPEGXSPictureSubDescriptor);
    uVar1 = *(undefined8 *)pMVar3->ul;
    uVar2 = *(undefined8 *)(pMVar3->ul + 8);
    (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((this->super_InterchangeObject).super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) =
         uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x14ef,
                "ASDCP::MXF::JPEGXSPictureSubDescriptor::JPEGXSPictureSubDescriptor(const Dictionary *)"
               );
}

Assistant:

JPEGXSPictureSubDescriptor::JPEGXSPictureSubDescriptor(const Dictionary* d) : InterchangeObject(d), JPEGXSPpih(0), JPEGXSPlev(0), JPEGXSWf(0), JPEGXSHf(0), JPEGXSNc(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_JPEGXSPictureSubDescriptor);
}